

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexReaderCache::PtexReaderCache
          (PtexReaderCache *this,int maxFiles,size_t maxMem,bool premultiply,
          PtexInputHandler *inputHandler,PtexErrorHandler *errorHandler)

{
  (this->super_PtexCache)._vptr_PtexCache = (_func_int **)&PTR__PtexReaderCache_031601f8;
  this->_maxFiles = (long)maxFiles;
  this->_maxMem = maxMem;
  this->_io = inputHandler;
  this->_err = errorHandler;
  (this->_searchpath)._M_dataplus._M_p = (pointer)&(this->_searchpath).field_2;
  (this->_searchpath)._M_string_length = 0;
  (this->_searchpath).field_2._M_local_buf[0] = '\0';
  (this->_searchdirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_searchdirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_searchdirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::PtexHashMap(&this->_files);
  this->_premultiply = premultiply;
  this->_memUsed = 0x4d0;
  this->_filesOpen = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->_mruLock,(pthread_mutexattr_t *)0x0);
  this->_mruList = this->_mruLists;
  this->_prevMruList = this->_mruLists + 1;
  (this->_openFiles)._end._prev = &(this->_openFiles)._end;
  (this->_openFiles)._end._next = &(this->_openFiles)._end;
  (this->_activeFiles)._end._prev = &(this->_activeFiles)._end;
  (this->_activeFiles)._end._next = &(this->_activeFiles)._end;
  this->_memUsed_pad[0] = '\0';
  this->_memUsed_pad[1] = '\0';
  this->_memUsed_pad[2] = '\0';
  this->_memUsed_pad[3] = '\0';
  this->_memUsed_pad[4] = '\0';
  this->_memUsed_pad[5] = '\0';
  this->_memUsed_pad[6] = '\0';
  this->_memUsed_pad[7] = '\0';
  this->_memUsed_pad[8] = '\0';
  this->_memUsed_pad[9] = '\0';
  this->_memUsed_pad[10] = '\0';
  this->_memUsed_pad[0xb] = '\0';
  this->_memUsed_pad[0xc] = '\0';
  this->_memUsed_pad[0xd] = '\0';
  this->_memUsed_pad[0xe] = '\0';
  this->_memUsed_pad[0xf] = '\0';
  this->_memUsed_pad[0x10] = '\0';
  this->_memUsed_pad[0x11] = '\0';
  this->_memUsed_pad[0x12] = '\0';
  this->_memUsed_pad[0x13] = '\0';
  this->_memUsed_pad[0x14] = '\0';
  this->_memUsed_pad[0x15] = '\0';
  this->_memUsed_pad[0x16] = '\0';
  this->_memUsed_pad[0x17] = '\0';
  this->_memUsed_pad[0x18] = '\0';
  this->_memUsed_pad[0x19] = '\0';
  this->_memUsed_pad[0x1a] = '\0';
  this->_memUsed_pad[0x1b] = '\0';
  this->_memUsed_pad[0x1c] = '\0';
  this->_memUsed_pad[0x1d] = '\0';
  this->_memUsed_pad[0x1e] = '\0';
  this->_memUsed_pad[0x1f] = '\0';
  this->_memUsed_pad[0x20] = '\0';
  this->_memUsed_pad[0x21] = '\0';
  this->_memUsed_pad[0x22] = '\0';
  this->_memUsed_pad[0x23] = '\0';
  this->_memUsed_pad[0x24] = '\0';
  this->_memUsed_pad[0x25] = '\0';
  this->_memUsed_pad[0x26] = '\0';
  this->_memUsed_pad[0x27] = '\0';
  this->_memUsed_pad[0x28] = '\0';
  this->_memUsed_pad[0x29] = '\0';
  this->_memUsed_pad[0x2a] = '\0';
  this->_memUsed_pad[0x2b] = '\0';
  this->_memUsed_pad[0x2c] = '\0';
  this->_memUsed_pad[0x2d] = '\0';
  this->_memUsed_pad[0x2e] = '\0';
  this->_memUsed_pad[0x2f] = '\0';
  this->_memUsed_pad[0x30] = '\0';
  this->_memUsed_pad[0x31] = '\0';
  this->_memUsed_pad[0x32] = '\0';
  this->_memUsed_pad[0x33] = '\0';
  this->_memUsed_pad[0x34] = '\0';
  this->_memUsed_pad[0x35] = '\0';
  this->_memUsed_pad[0x36] = '\0';
  this->_memUsed_pad[0x37] = '\0';
  this->_filesOpen_pad[0] = '\0';
  this->_filesOpen_pad[1] = '\0';
  this->_filesOpen_pad[2] = '\0';
  this->_filesOpen_pad[3] = '\0';
  this->_filesOpen_pad[4] = '\0';
  this->_filesOpen_pad[5] = '\0';
  this->_filesOpen_pad[6] = '\0';
  this->_filesOpen_pad[7] = '\0';
  this->_filesOpen_pad[8] = '\0';
  this->_filesOpen_pad[9] = '\0';
  this->_filesOpen_pad[10] = '\0';
  this->_filesOpen_pad[0xb] = '\0';
  this->_filesOpen_pad[0xc] = '\0';
  this->_filesOpen_pad[0xd] = '\0';
  this->_filesOpen_pad[0xe] = '\0';
  this->_filesOpen_pad[0xf] = '\0';
  this->_filesOpen_pad[0x10] = '\0';
  this->_filesOpen_pad[0x11] = '\0';
  this->_filesOpen_pad[0x12] = '\0';
  this->_filesOpen_pad[0x13] = '\0';
  this->_filesOpen_pad[0x14] = '\0';
  this->_filesOpen_pad[0x15] = '\0';
  this->_filesOpen_pad[0x16] = '\0';
  this->_filesOpen_pad[0x17] = '\0';
  this->_filesOpen_pad[0x18] = '\0';
  this->_filesOpen_pad[0x19] = '\0';
  this->_filesOpen_pad[0x1a] = '\0';
  this->_filesOpen_pad[0x1b] = '\0';
  this->_filesOpen_pad[0x1c] = '\0';
  this->_filesOpen_pad[0x1d] = '\0';
  this->_filesOpen_pad[0x1e] = '\0';
  this->_filesOpen_pad[0x1f] = '\0';
  this->_filesOpen_pad[0x20] = '\0';
  this->_filesOpen_pad[0x21] = '\0';
  this->_filesOpen_pad[0x22] = '\0';
  this->_filesOpen_pad[0x23] = '\0';
  this->_filesOpen_pad[0x24] = '\0';
  this->_filesOpen_pad[0x25] = '\0';
  this->_filesOpen_pad[0x26] = '\0';
  this->_filesOpen_pad[0x27] = '\0';
  this->_filesOpen_pad[0x28] = '\0';
  this->_filesOpen_pad[0x29] = '\0';
  this->_filesOpen_pad[0x2a] = '\0';
  this->_filesOpen_pad[0x2b] = '\0';
  this->_filesOpen_pad[0x2c] = '\0';
  this->_filesOpen_pad[0x2d] = '\0';
  this->_filesOpen_pad[0x2e] = '\0';
  this->_filesOpen_pad[0x2f] = '\0';
  this->_filesOpen_pad[0x30] = '\0';
  this->_filesOpen_pad[0x31] = '\0';
  this->_filesOpen_pad[0x32] = '\0';
  this->_filesOpen_pad[0x33] = '\0';
  this->_filesOpen_pad[0x34] = '\0';
  this->_filesOpen_pad[0x35] = '\0';
  this->_filesOpen_pad[0x36] = '\0';
  this->_filesOpen_pad[0x37] = '\0';
  memset(this->_mruLock_pad,0,0x348);
  this->_peakMemUsed = 0;
  this->_peakFilesOpen = 0;
  this->_fileOpens = 0;
  this->_blockReads = 0;
  return;
}

Assistant:

PtexReaderCache(int maxFiles, size_t maxMem, bool premultiply, PtexInputHandler* inputHandler, PtexErrorHandler* errorHandler)
        : _maxFiles(maxFiles), _maxMem(maxMem), _io(inputHandler), _err(errorHandler), _premultiply(premultiply),
          _memUsed(sizeof(*this)), _filesOpen(0), _mruList(&_mruLists[0]), _prevMruList(&_mruLists[1]),
          _peakMemUsed(0), _peakFilesOpen(0), _fileOpens(0), _blockReads(0)
    {
        memset((void*)&_mruLists[0], 0, sizeof(_mruLists));
        CACHE_LINE_PAD_INIT(_memUsed); // keep cppcheck happy
        CACHE_LINE_PAD_INIT(_filesOpen);
        CACHE_LINE_PAD_INIT(_mruLock);
    }